

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O1

void dradbg(int ido,int ip,int l1,int idl1,float *cc,float *c1,float *c2,float *ch,float *ch2,
           float *wa)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  float *pfVar8;
  int iVar9;
  ulong uVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float *pfVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int local_9c;
  int local_4c;
  int local_48;
  int local_44;
  
  iVar19 = ip * ido;
  dVar21 = cos((double)(6.2831855 / (float)ip));
  dVar22 = sin((double)(6.2831855 / (float)ip));
  iVar1 = ip + 1 >> 1;
  if (ido < l1) {
    if (0 < ido) {
      uVar10 = 0;
      pfVar6 = ch;
      pfVar11 = cc;
      do {
        pfVar16 = pfVar6;
        pfVar8 = pfVar11;
        iVar13 = l1;
        if (0 < l1) {
          do {
            *pfVar16 = *pfVar8;
            iVar13 = iVar13 + -1;
            pfVar16 = pfVar16 + (uint)ido;
            pfVar8 = pfVar8 + iVar19;
          } while (iVar13 != 0);
        }
        uVar10 = uVar10 + 1;
        pfVar11 = pfVar11 + 1;
        pfVar6 = pfVar6 + 1;
      } while (uVar10 != (uint)ido);
    }
  }
  else if (0 < l1) {
    iVar13 = 0;
    pfVar6 = ch;
    pfVar11 = cc;
    do {
      if (0 < ido) {
        lVar3 = 0;
        do {
          pfVar6[lVar3] = pfVar11[lVar3];
          lVar3 = lVar3 + 1;
        } while (ido != (int)lVar3);
      }
      iVar13 = iVar13 + 1;
      pfVar11 = pfVar11 + iVar19;
      pfVar6 = pfVar6 + ido;
    } while (iVar13 != l1);
  }
  iVar2 = l1 * ido;
  iVar13 = ido * 2;
  if (1 < iVar1) {
    iVar4 = (ip + -1) * l1 * ido;
    pfVar6 = cc + iVar13;
    iVar12 = 1;
    iVar14 = iVar2;
    do {
      if (0 < l1) {
        pfVar11 = ch;
        pfVar16 = pfVar6;
        iVar7 = l1;
        do {
          pfVar11[iVar14] = pfVar16[-1] + pfVar16[-1];
          pfVar11[iVar4] = *pfVar16 + *pfVar16;
          pfVar11 = pfVar11 + ido;
          pfVar16 = pfVar16 + iVar19;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      iVar12 = iVar12 + 1;
      iVar14 = iVar14 + iVar2;
      iVar4 = iVar4 - iVar2;
      pfVar6 = pfVar6 + iVar13;
    } while (iVar12 != iVar1);
  }
  iVar14 = ido + -1 >> 1;
  if (ido != 1) {
    if (iVar14 < l1) {
      if (1 < iVar1) {
        local_9c = iVar13 + -2;
        local_44 = iVar13 + 2;
        local_48 = (ip + -1) * iVar2 + 2;
        local_4c = iVar2 + 2;
        iVar4 = 1;
        do {
          if (2 < ido) {
            iVar9 = 2;
            iVar12 = local_4c;
            iVar7 = local_48;
            iVar15 = local_44;
            iVar5 = local_9c;
            do {
              if (0 < l1) {
                pfVar6 = ch;
                pfVar11 = cc;
                iVar17 = l1;
                do {
                  pfVar6[(long)iVar12 + -1] = pfVar11[(long)iVar15 + -1] + pfVar11[(long)iVar5 + -1]
                  ;
                  pfVar6[(long)iVar7 + -1] = pfVar11[(long)iVar15 + -1] - pfVar11[(long)iVar5 + -1];
                  pfVar6[iVar12] = pfVar11[iVar15] - pfVar11[iVar5];
                  pfVar6[iVar7] = pfVar11[iVar15] + pfVar11[iVar5];
                  pfVar6 = pfVar6 + ido;
                  pfVar11 = pfVar11 + iVar19;
                  iVar17 = iVar17 + -1;
                } while (iVar17 != 0);
              }
              iVar9 = iVar9 + 2;
              iVar5 = iVar5 + -2;
              iVar15 = iVar15 + 2;
              iVar7 = iVar7 + 2;
              iVar12 = iVar12 + 2;
            } while (iVar9 < ido);
          }
          iVar4 = iVar4 + 1;
          local_9c = local_9c + iVar13;
          local_44 = local_44 + iVar13;
          local_48 = local_48 - iVar2;
          local_4c = local_4c + iVar2;
        } while (iVar4 != iVar1);
      }
    }
    else if (1 < iVar1) {
      iVar7 = (ip + -1) * l1 * ido;
      iVar15 = 1;
      iVar4 = iVar2;
      iVar12 = iVar13;
      do {
        if (0 < l1) {
          pfVar6 = ch + (long)iVar4 + 2;
          pfVar11 = ch + (long)iVar7 + 2;
          pfVar16 = cc + iVar12;
          iVar5 = 0;
          do {
            if (2 < ido) {
              lVar18 = -2;
              lVar3 = 0;
              do {
                pfVar6[lVar3 + -1] = pfVar16[lVar3 + 1] + pfVar16[lVar18 + -1];
                pfVar11[lVar3 + -1] = pfVar16[lVar3 + 1] - pfVar16[lVar18 + -1];
                pfVar6[lVar3] = pfVar16[lVar3 + 2] - pfVar16[lVar18];
                pfVar11[lVar3] = pfVar16[lVar3 + 2] + pfVar16[lVar18];
                lVar18 = lVar18 + -2;
                iVar9 = (int)lVar3;
                lVar3 = lVar3 + 2;
              } while (iVar9 + 4 < ido);
            }
            iVar5 = iVar5 + 1;
            pfVar6 = pfVar6 + ido;
            pfVar11 = pfVar11 + ido;
            pfVar16 = pfVar16 + iVar19;
          } while (iVar5 != l1);
        }
        iVar15 = iVar15 + 1;
        iVar12 = iVar12 + iVar13;
        iVar7 = iVar7 - iVar2;
        iVar4 = iVar4 + iVar2;
      } while (iVar15 != iVar1);
    }
  }
  iVar19 = ip + -1;
  if (1 < iVar1) {
    iVar4 = iVar19 * idl1;
    lVar3 = (long)iVar4;
    fVar23 = 0.0;
    iVar12 = 1;
    fVar25 = 1.0;
    iVar13 = idl1;
    do {
      fVar24 = (float)dVar21 * fVar25 - (float)dVar22 * fVar23;
      fVar23 = fVar23 * (float)dVar21 + fVar25 * (float)dVar22;
      if (0 < idl1) {
        uVar10 = 0;
        do {
          c2[(long)iVar13 + uVar10] = ch2[(long)idl1 + uVar10] * fVar24 + ch2[uVar10];
          c2[(long)iVar4 + uVar10] = ch2[lVar3 + uVar10] * fVar23;
          uVar10 = uVar10 + 1;
        } while ((uint)idl1 != uVar10);
      }
      if (iVar1 != 2) {
        iVar5 = 2;
        fVar25 = fVar23;
        fVar26 = fVar24;
        iVar7 = idl1 * 2;
        iVar15 = (ip + -2) * idl1;
        do {
          fVar27 = fVar24 * fVar26 + fVar25 * -fVar23;
          fVar25 = fVar26 * fVar23 + fVar24 * fVar25;
          if (0 < idl1) {
            lVar18 = 0;
            do {
              c2[iVar13 + lVar18] = ch2[iVar7 + lVar18] * fVar27 + c2[iVar13 + lVar18];
              c2[iVar4 + lVar18] = ch2[iVar15 + lVar18] * fVar25 + c2[iVar4 + lVar18];
              lVar18 = lVar18 + 1;
            } while (idl1 != (int)lVar18);
          }
          iVar5 = iVar5 + 1;
          iVar15 = iVar15 - idl1;
          iVar7 = iVar7 + idl1;
          fVar26 = fVar27;
        } while (iVar5 != iVar1);
      }
      iVar12 = iVar12 + 1;
      iVar4 = iVar4 - idl1;
      iVar13 = iVar13 + idl1;
      fVar25 = fVar24;
    } while (iVar12 != iVar1);
  }
  if (1 < iVar1) {
    iVar4 = 1;
    iVar13 = idl1;
    do {
      if (0 < idl1) {
        uVar10 = 0;
        do {
          ch2[uVar10] = ch2[(long)iVar13 + uVar10] + ch2[uVar10];
          uVar10 = uVar10 + 1;
        } while ((uint)idl1 != uVar10);
      }
      iVar4 = iVar4 + 1;
      iVar13 = iVar13 + idl1;
    } while (iVar4 != iVar1);
  }
  if (1 < iVar1) {
    iVar4 = l1 * ido * iVar19;
    iVar12 = 1;
    iVar13 = iVar2;
    do {
      if (0 < l1) {
        lVar3 = (long)iVar4;
        lVar18 = (long)iVar13;
        lVar20 = 0;
        iVar7 = l1;
        do {
          *(float *)((long)ch + lVar20 + lVar18 * 4) =
               *(float *)((long)c1 + lVar20 + lVar18 * 4) -
               *(float *)((long)c1 + lVar20 + lVar3 * 4);
          *(float *)((long)ch + lVar20 + lVar3 * 4) =
               *(float *)((long)c1 + lVar20 + lVar18 * 4) +
               *(float *)((long)c1 + lVar20 + lVar3 * 4);
          lVar20 = lVar20 + (long)ido * 4;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      iVar12 = iVar12 + 1;
      iVar13 = iVar13 + iVar2;
      iVar4 = iVar4 - iVar2;
    } while (iVar12 != iVar1);
  }
  if (ido != 1) {
    if (iVar14 < l1) {
      if (1 < iVar1) {
        local_9c = iVar19 * iVar2 + 2;
        iVar19 = iVar2 + 2;
        iVar13 = 1;
        do {
          if (2 < ido) {
            iVar7 = 2;
            iVar12 = local_9c;
            iVar4 = iVar19;
            do {
              if (0 < l1) {
                lVar18 = (long)iVar4;
                lVar3 = (long)iVar12;
                lVar20 = 0;
                iVar15 = l1;
                do {
                  *(float *)((long)ch + lVar20 + lVar18 * 4 + -4) =
                       *(float *)((long)c1 + lVar20 + lVar18 * 4 + -4) -
                       *(float *)((long)c1 + lVar20 + lVar3 * 4);
                  *(float *)((long)ch + lVar20 + lVar3 * 4 + -4) =
                       *(float *)((long)c1 + lVar20 + lVar18 * 4 + -4) +
                       *(float *)((long)c1 + lVar20 + lVar3 * 4);
                  *(float *)((long)ch + lVar20 + lVar18 * 4) =
                       *(float *)((long)c1 + lVar20 + lVar18 * 4) +
                       *(float *)((long)c1 + lVar20 + lVar3 * 4 + -4);
                  *(float *)((long)ch + lVar20 + lVar3 * 4) =
                       *(float *)((long)c1 + lVar20 + lVar18 * 4) -
                       *(float *)((long)c1 + lVar20 + lVar3 * 4 + -4);
                  lVar20 = lVar20 + (long)ido * 4;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              iVar7 = iVar7 + 2;
              iVar12 = iVar12 + 2;
              iVar4 = iVar4 + 2;
            } while (iVar7 < ido);
          }
          iVar13 = iVar13 + 1;
          local_9c = local_9c - iVar2;
          iVar19 = iVar19 + iVar2;
        } while (iVar13 != iVar1);
      }
    }
    else if (1 < iVar1) {
      iVar19 = l1 * ido * iVar19;
      iVar4 = 1;
      iVar13 = iVar2;
      do {
        if (0 < l1) {
          pfVar6 = c1 + (long)iVar13 + 2;
          pfVar11 = ch + (long)iVar13 + 2;
          pfVar16 = ch + (long)iVar19 + 2;
          pfVar8 = c1 + (long)iVar19 + 2;
          iVar12 = 0;
          do {
            if (2 < ido) {
              lVar3 = 0;
              do {
                pfVar11[lVar3 + -1] = pfVar6[lVar3 + -1] - pfVar8[lVar3];
                pfVar16[lVar3 + -1] = pfVar6[lVar3 + -1] + pfVar8[lVar3];
                pfVar11[lVar3] = pfVar6[lVar3] + pfVar8[lVar3 + -1];
                pfVar16[lVar3] = pfVar6[lVar3] - pfVar8[lVar3 + -1];
                iVar7 = (int)lVar3;
                lVar3 = lVar3 + 2;
              } while (iVar7 + 4 < ido);
            }
            iVar12 = iVar12 + 1;
            pfVar6 = pfVar6 + ido;
            pfVar11 = pfVar11 + ido;
            pfVar16 = pfVar16 + ido;
            pfVar8 = pfVar8 + ido;
          } while (iVar12 != l1);
        }
        iVar4 = iVar4 + 1;
        iVar19 = iVar19 - iVar2;
        iVar13 = iVar13 + iVar2;
      } while (iVar4 != iVar1);
    }
    if (0 < idl1) {
      uVar10 = 0;
      do {
        c2[uVar10] = ch2[uVar10];
        uVar10 = uVar10 + 1;
      } while ((uint)idl1 != uVar10);
    }
    if (1 < ip) {
      iVar19 = 1;
      iVar1 = iVar2;
      do {
        if (0 < l1) {
          lVar3 = (long)iVar1 << 2;
          iVar13 = l1;
          do {
            *(undefined4 *)((long)c1 + lVar3) = *(undefined4 *)((long)ch + lVar3);
            lVar3 = lVar3 + (long)ido * 4;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        iVar19 = iVar19 + 1;
        iVar1 = iVar1 + iVar2;
      } while (iVar19 != ip);
    }
    if (l1 < iVar14) {
      if (1 < ip) {
        iVar19 = 1;
        iVar13 = -1;
        iVar1 = iVar2;
        do {
          if (0 < l1) {
            pfVar6 = ch + iVar1;
            pfVar11 = c1 + iVar1;
            iVar14 = 0;
            do {
              if (2 < ido) {
                lVar3 = 2;
                do {
                  pfVar11[lVar3 + -1] =
                       wa[(long)iVar13 + lVar3 + -1] * pfVar6[lVar3 + -1] -
                       pfVar6[lVar3] * wa[iVar13 + lVar3];
                  pfVar11[lVar3] =
                       wa[(long)iVar13 + lVar3 + -1] * pfVar6[lVar3] +
                       wa[iVar13 + lVar3] * pfVar6[lVar3 + -1];
                  lVar3 = lVar3 + 2;
                } while ((int)lVar3 < ido);
              }
              iVar14 = iVar14 + 1;
              pfVar6 = pfVar6 + ido;
              pfVar11 = pfVar11 + ido;
            } while (iVar14 != l1);
          }
          iVar19 = iVar19 + 1;
          iVar13 = iVar13 + ido;
          iVar1 = iVar1 + iVar2;
        } while (iVar19 != ip);
      }
    }
    else if (1 < ip) {
      iVar1 = iVar2 + 2;
      iVar19 = 1;
      iVar13 = -1;
      do {
        if (2 < ido) {
          iVar4 = 2;
          lVar3 = (long)iVar13;
          iVar14 = iVar1;
          do {
            lVar18 = lVar3 + 2;
            if (0 < l1) {
              lVar20 = (long)iVar14 << 2;
              iVar12 = l1;
              do {
                *(float *)((long)c1 + lVar20 + -4) =
                     wa[lVar3 + 1] * *(float *)((long)ch + lVar20 + -4) -
                     *(float *)((long)ch + lVar20) * wa[lVar18];
                *(float *)((long)c1 + lVar20) =
                     wa[lVar3 + 1] * *(float *)((long)ch + lVar20) +
                     wa[lVar18] * *(float *)((long)ch + lVar20 + -4);
                lVar20 = lVar20 + (long)ido * 4;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            iVar4 = iVar4 + 2;
            iVar14 = iVar14 + 2;
            lVar3 = lVar18;
          } while (iVar4 < ido);
        }
        iVar19 = iVar19 + 1;
        iVar1 = iVar1 + iVar2;
        iVar13 = iVar13 + ido;
      } while (iVar19 != ip);
    }
  }
  return;
}

Assistant:

static void dradbg(int ido,int ip,int l1,int idl1,float *cc,float *c1,
            float *c2,float *ch,float *ch2,float *wa){
  static float tpi=6.283185307179586f;
  int idij,ipph,i,j,k,l,ik,is,t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10,
      t11,t12;
  float dc2,ai1,ai2,ar1,ar2,ds2;
  int nbd;
  float dcp,arg,dsp,ar1h,ar2h;
  int ipp2;

  t10=ip*ido;
  t0=l1*ido;
  arg=tpi/(float)ip;
  dcp=cos(arg);
  dsp=sin(arg);
  nbd=(ido-1)>>1;
  ipp2=ip;
  ipph=(ip+1)>>1;
  if(ido<l1)goto L103;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t4=t2;
    for(i=0;i<ido;i++){
      ch[t3]=cc[t4];
      t3++;
      t4++;
    }
    t1+=ido;
    t2+=t10;
  }
  goto L106;

 L103:
  t1=0;
  for(i=0;i<ido;i++){
    t2=t1;
    t3=t1;
    for(k=0;k<l1;k++){
      ch[t2]=cc[t3];
      t2+=ido;
      t3+=t10;
    }
    t1++;
  }

 L106:
  t1=0;
  t2=ipp2*t0;
  t7=(t5=ido<<1);
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    t6=t5;
    for(k=0;k<l1;k++){
      ch[t3]=cc[t6-1]+cc[t6-1];
      ch[t4]=cc[t6]+cc[t6];
      t3+=ido;
      t4+=ido;
      t6+=t10;
    }
    t5+=t7;
  }

  if (ido == 1)goto L116;
  if(nbd<l1)goto L112;

  t1=0;
  t2=ipp2*t0;
  t7=0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;

    t7+=(ido<<1);
    t8=t7;
    for(k=0;k<l1;k++){
      t5=t3;
      t6=t4;
      t9=t8;
      t11=t8;
      for(i=2;i<ido;i+=2){
        t5+=2;
        t6+=2;
        t9+=2;
        t11-=2;
        ch[t5-1]=cc[t9-1]+cc[t11-1];
        ch[t6-1]=cc[t9-1]-cc[t11-1];
        ch[t5]=cc[t9]-cc[t11];
        ch[t6]=cc[t9]+cc[t11];
      }
      t3+=ido;
      t4+=ido;
      t8+=t10;
    }
  }
  goto L116;

 L112:
  t1=0;
  t2=ipp2*t0;
  t7=0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    t7+=(ido<<1);
    t8=t7;
    t9=t7;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t8+=2;
      t9-=2;
      t5=t3;
      t6=t4;
      t11=t8;
      t12=t9;
      for(k=0;k<l1;k++){
        ch[t5-1]=cc[t11-1]+cc[t12-1];
        ch[t6-1]=cc[t11-1]-cc[t12-1];
        ch[t5]=cc[t11]-cc[t12];
        ch[t6]=cc[t11]+cc[t12];
        t5+=ido;
        t6+=ido;
        t11+=t10;
        t12+=t10;
      }
    }
  }

L116:
  ar1=1.f;
  ai1=0.f;
  t1=0;
  t9=(t2=ipp2*idl1);
  t3=(ip-1)*idl1;
  for(l=1;l<ipph;l++){
    t1+=idl1;
    t2-=idl1;

    ar1h=dcp*ar1-dsp*ai1;
    ai1=dcp*ai1+dsp*ar1;
    ar1=ar1h;
    t4=t1;
    t5=t2;
    t6=0;
    t7=idl1;
    t8=t3;
    for(ik=0;ik<idl1;ik++){
      c2[t4++]=ch2[t6++]+ar1*ch2[t7++];
      c2[t5++]=ai1*ch2[t8++];
    }
    dc2=ar1;
    ds2=ai1;
    ar2=ar1;
    ai2=ai1;

    t6=idl1;
    t7=t9-idl1;
    for(j=2;j<ipph;j++){
      t6+=idl1;
      t7-=idl1;
      ar2h=dc2*ar2-ds2*ai2;
      ai2=dc2*ai2+ds2*ar2;
      ar2=ar2h;
      t4=t1;
      t5=t2;
      t11=t6;
      t12=t7;
      for(ik=0;ik<idl1;ik++){
        c2[t4++]+=ar2*ch2[t11++];
        c2[t5++]+=ai2*ch2[t12++];
      }
    }
  }

  t1=0;
  for(j=1;j<ipph;j++){
    t1+=idl1;
    t2=t1;
    for(ik=0;ik<idl1;ik++)ch2[ik]+=ch2[t2++];
  }

  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(k=0;k<l1;k++){
      ch[t3]=c1[t3]-c1[t4];
      ch[t4]=c1[t3]+c1[t4];
      t3+=ido;
      t4+=ido;
    }
  }

  if(ido==1)goto L132;
  if(nbd<l1)goto L128;

  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(k=0;k<l1;k++){
      t5=t3;
      t6=t4;
      for(i=2;i<ido;i+=2){
        t5+=2;
        t6+=2;
        ch[t5-1]=c1[t5-1]-c1[t6];
        ch[t6-1]=c1[t5-1]+c1[t6];
        ch[t5]=c1[t5]+c1[t6-1];
        ch[t6]=c1[t5]-c1[t6-1];
      }
      t3+=ido;
      t4+=ido;
    }
  }
  goto L132;

 L128:
  t1=0;
  t2=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1;
    t4=t2;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t5=t3;
      t6=t4;
      for(k=0;k<l1;k++){
        ch[t5-1]=c1[t5-1]-c1[t6];
        ch[t6-1]=c1[t5-1]+c1[t6];
        ch[t5]=c1[t5]+c1[t6-1];
        ch[t6]=c1[t5]-c1[t6-1];
        t5+=ido;
        t6+=ido;
      }
    }
  }

L132:
  if(ido==1)return;

  for(ik=0;ik<idl1;ik++)c2[ik]=ch2[ik];

  t1=0;
  for(j=1;j<ip;j++){
    t2=(t1+=t0);
    for(k=0;k<l1;k++){
      c1[t2]=ch[t2];
      t2+=ido;
    }
  }

  if(nbd>l1)goto L139;

  is= -ido-1;
  t1=0;
  for(j=1;j<ip;j++){
    is+=ido;
    t1+=t0;
    idij=is;
    t2=t1;
    for(i=2;i<ido;i+=2){
      t2+=2;
      idij+=2;
      t3=t2;
      for(k=0;k<l1;k++){
        c1[t3-1]=wa[idij-1]*ch[t3-1]-wa[idij]*ch[t3];
        c1[t3]=wa[idij-1]*ch[t3]+wa[idij]*ch[t3-1];
        t3+=ido;
      }
    }
  }
  return;

 L139:
  is= -ido-1;
  t1=0;
  for(j=1;j<ip;j++){
    is+=ido;
    t1+=t0;
    t2=t1;
    for(k=0;k<l1;k++){
      idij=is;
      t3=t2;
      for(i=2;i<ido;i+=2){
        idij+=2;
        t3+=2;
        c1[t3-1]=wa[idij-1]*ch[t3-1]-wa[idij]*ch[t3];
        c1[t3]=wa[idij-1]*ch[t3]+wa[idij]*ch[t3-1];
      }
      t2+=ido;
    }
  }
}